

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.h
# Opt level: O2

Type * __thiscall
mnf::Manifold::getView<2,0>
          (Type *__return_storage_ptr__,Manifold *this,RefMat *val,size_t param_2,size_t ic)

{
  Index startCol;
  Index numCols;
  
  startCol = getStart<0>(this,ic);
  numCols = getDim<0>(this,ic);
  Eigen::
  DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>::
  middleCols<long>(__return_storage_ptr__,
                   (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    *)val,startCol,numCols);
  return __return_storage_ptr__;
}

Assistant:

inline typename ViewReturnType<F, R>::Type Manifold::getView<F, R>(
    RefMat val, size_t, size_t ic) const
{
  return val.middleCols(getStart<R>(ic), getDim<R>(ic));
}